

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::eval<0>(RuleWavelet *this,int point,double x)

{
  double extraout_XMM0_Qa;
  RuleWavelet *local_48;
  double w;
  double node;
  double x_local;
  int point_local;
  RuleWavelet *this_local;
  
  if (this->order == 1) {
    if (point < 3) {
      getNode(this,point);
      ::std::abs((int)this);
      local_48 = (RuleWavelet *)(1.0 - extraout_XMM0_Qa);
      if ((double)local_48 < 0.0) {
        local_48 = (RuleWavelet *)0x0;
      }
      this_local = local_48;
    }
    else {
      this_local = (RuleWavelet *)eval_linear<0>(this,point,x);
    }
  }
  else if (this->order == 3) {
    this_local = (RuleWavelet *)eval_cubic<0>(this,point,x);
  }
  else {
    this_local = (RuleWavelet *)0x0;
  }
  return (double)this_local;
}

Assistant:

double RuleWavelet::eval(int point, double x) const{
    // Evaluates or differentiates a wavelet designated by point at coordinate x.
    if(order == 1){
        // Level 0
        if (point < 3){
            double node = getNode(point);
            if (mode == 0) {
                double w = 1.0 - std::abs(x - node);
                return (w < 0.0) ? 0.0 : w;
            }else{
                // Preserve the symmetry of derivatives as much as possible.
                if (point == 0) return (x < 0.0) ? 1.0 : -1.0;
                else if (point == 1) return (x < 0.0) ? -1.0 : 0.0;
                else return (x < 0.0) ? 0.0 : 1.0;
            }
        }
        // Level 1+
        return eval_linear<mode>(point, x);
    }
    else if(order == 3){
        return eval_cubic<mode>(point, x);
    }
    return 0.;
}